

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamAttribute::QXmlStreamAttribute
          (QXmlStreamAttribute *this,QString *qualifiedName,QString *value)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_value).m_string.ptr = (char16_t *)0x0;
  (this->m_value).m_string.size = 0;
  (this->m_qualifiedName).m_string.size = 0;
  (this->m_value).m_string.d = (Data *)0x0;
  (this->m_qualifiedName).m_string.d = (Data *)0x0;
  (this->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
  (this->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
  (this->m_namespaceUri).m_string.size = 0;
  (this->m_name).m_string.size = 0;
  (this->m_namespaceUri).m_string.d = (Data *)0x0;
  (this->m_name).m_string.d = (Data *)0x0;
  (this->m_name).m_string.ptr = (char16_t *)0x0;
  qVar2 = QString::indexOf(qualifiedName,(QChar)0x3a,0,CaseSensitive);
  QString::mid(&local_48,qualifiedName,qVar2 + 1,-1);
  data = &((this->m_name).m_string.d)->super_QArrayData;
  pcVar1 = (this->m_name).m_string.ptr;
  (this->m_name).m_string.d = local_48.d.d;
  (this->m_name).m_string.ptr = local_48.d.ptr;
  qVar2 = (this->m_name).m_string.size;
  (this->m_name).m_string.size = local_48.d.size;
  local_48.d.d = (Data *)data;
  local_48.d.ptr = pcVar1;
  local_48.d.size = qVar2;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  QArrayDataPointer<char16_t>::operator=(&(this->m_qualifiedName).m_string,&qualifiedName->d);
  QArrayDataPointer<char16_t>::operator=(&(this->m_value).m_string,&value->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamAttribute::QXmlStreamAttribute(const QString &qualifiedName, const QString &value)
{
    qsizetype colon = qualifiedName.indexOf(u':');
    m_name = qualifiedName.mid(colon + 1);
    m_qualifiedName = qualifiedName;
    m_value = value;
}